

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_packBytes(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint argc;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_packBytes::desc.min_argc_ = 1;
      getp_packBytes::desc.opt_argc_ = 0;
      getp_packBytes::desc.varargs_ = 1;
      __cxa_guard_release(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_packBytes::desc);
  if (iVar3 == 0) {
    check_raw_write(this);
    pvVar2 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    lVar4 = get_pos(this);
    CVmPack::pack(1,argc,*(CVmDataSource **)((this->super_CVmObject).ext_ + 8));
    sp_ = sp_ + -(long)(int)(argc + 1);
    lVar5 = get_pos(this);
    retval->typ = VM_INT;
    (retval->val).obj = (int)lVar5 - (int)lVar4;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_packBytes(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check that the it's a valid file open with write access in "raw" mode */
    check_raw_write(vmg0_);

    /* save 'self' for gc protection */
    G_stk->push_obj(vmg_ self);

    /* remember the starting seek position */
    long start = get_pos(vmg0_);

    /* pack the arguments into our file data stream */
    CVmPack::pack(vmg_ 1, argc, get_ext()->fp);

    /* discard our gc protection and our arguments */
    G_stk->discard(argc + 1);

    /* return the number of bytes packed */
    retval->set_int(get_pos(vmg0_) - start);
    
    /* handled */
    return TRUE;
}